

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O2

opj_bool jp2_read_tile_header
                   (opj_jp2_v2_t *p_jp2,OPJ_UINT32 *p_tile_index,OPJ_UINT32 *p_data_size,
                   OPJ_INT32 *p_tile_x0,OPJ_INT32 *p_tile_y0,OPJ_INT32 *p_tile_x1,
                   OPJ_INT32 *p_tile_y1,OPJ_UINT32 *p_nb_comps,opj_bool *p_go_on,
                   opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  opj_bool oVar1;
  
  oVar1 = j2k_read_tile_header
                    (p_jp2->j2k,p_tile_index,p_data_size,p_tile_x0,p_tile_y0,p_tile_x1,p_tile_y1,
                     p_nb_comps,p_go_on,p_stream,p_manager);
  return oVar1;
}

Assistant:

opj_bool jp2_read_tile_header(	opj_jp2_v2_t * p_jp2,
					 	 		OPJ_UINT32 * p_tile_index,
					 	 		OPJ_UINT32 * p_data_size,
					 	 		OPJ_INT32 * p_tile_x0, OPJ_INT32 * p_tile_y0,
					 	 		OPJ_INT32 * p_tile_x1, OPJ_INT32 * p_tile_y1,
					 	 		OPJ_UINT32 * p_nb_comps,
					 	 		opj_bool * p_go_on,
					 	 		opj_stream_private_t *p_stream,
					 	 		opj_event_mgr_t * p_manager )
{
	return j2k_read_tile_header(p_jp2->j2k,
								p_tile_index,
								p_data_size,
								p_tile_x0, p_tile_y0,
								p_tile_x1, p_tile_y1,
								p_nb_comps,
								p_go_on,
								p_stream,
								p_manager);
}